

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

void __thiscall myvk::Device::~Device(Device *this)

{
  Device *in_RDI;
  
  ~Device(in_RDI);
  operator_delete(in_RDI,0x280);
  return;
}

Assistant:

Device::~Device() {
	if (m_pipeline_cache)
		vkDestroyPipelineCache(m_device, m_pipeline_cache, nullptr);
	if (m_allocator)
		vmaDestroyAllocator(m_allocator);
	if (m_device)
		vkDestroyDevice(m_device, nullptr);
}